

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ne_filesystem.cpp
# Opt level: O0

char * allocate_copy_string_result(uint64_t *result,char *str,size_t size)

{
  uint8_t *__dest;
  void *memory;
  size_t size_local;
  char *str_local;
  uint64_t *result_local;
  
  __dest = (*ne_core_allocate)(result,size + 1);
  if (__dest != (uint8_t *)0x0) {
    memcpy(__dest,str,size + 1);
  }
  return (char *)__dest;
}

Assistant:

static char *allocate_copy_string_result(uint64_t *result,
                                         const char *str,
                                         size_t size)
{
  // +1 for the null terminator.
  ++size;
  void *memory = ne_core_allocate(result, size);
  if (memory != nullptr)
  {
    std::memcpy(memory, str, size);
  }
  return static_cast<char *>(memory);
}